

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::Convolution3DLayerParams::mutable_weights(Convolution3DLayerParams *this)

{
  WeightParams *this_00;
  Convolution3DLayerParams *this_local;
  
  if (this->weights_ == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->weights_ = this_00;
  }
  return this->weights_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* Convolution3DLayerParams::mutable_weights() {
  
  if (weights_ == NULL) {
    weights_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Convolution3DLayerParams.weights)
  return weights_;
}